

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putcontig8bitYCbCr41tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  byte bVar2;
  TIFFRGBAImage *pTVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint Cb;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t local_6c;
  TIFFRGBAImage *local_68;
  uint *local_60;
  uint local_54;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_40 = (long)toskew;
  local_54 = w >> 2;
  local_38 = (ulong)(w & 3);
  local_48 = (long)((fromskew / 4) * 6);
  local_50 = (ulong)((w & 3) * 4);
  uVar6 = local_54;
  local_6c = h;
  local_68 = img;
  local_60 = cp;
  do {
    while (puVar4 = local_60, pTVar3 = local_68, uVar6 != 0) {
      bVar1 = pp[4];
      Cb = (uint)bVar1;
      bVar2 = pp[5];
      uVar5 = (uint)bVar2;
      TIFFYCbCrtoRGB(local_68->ycbcr,(uint)*pp,Cb,uVar5,&r,&g,&b);
      puVar4 = local_60;
      *local_60 = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[1],(uint)bVar1,(uint)bVar2,&r,&g,&b);
      puVar4[1] = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[2],Cb,uVar5,&r,&g,&b);
      puVar4[2] = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[3],Cb,uVar5,&r,&g,&b);
      puVar4[3] = b << 0x10 | 0xff000000 | g << 8 | r;
      local_60 = puVar4 + 4;
      pp = pp + 6;
      uVar6 = uVar6 - 1;
    }
    iVar7 = (int)local_38;
    if (iVar7 != 0) {
      uVar6 = (uint)pp[4];
      uVar5 = (uint)pp[5];
      if (iVar7 != 1) {
        if (iVar7 != 2) {
          TIFFYCbCrtoRGB(local_68->ycbcr,(uint)pp[2],uVar6,uVar5,&r,&g,&b);
          puVar4[2] = g << 8 | r | b << 0x10 | 0xff000000;
        }
        TIFFYCbCrtoRGB(local_68->ycbcr,(uint)pp[1],uVar6,uVar5,&r,&g,&b);
        puVar4[1] = g << 8 | r | b << 0x10 | 0xff000000;
      }
      TIFFYCbCrtoRGB(local_68->ycbcr,(uint)*pp,uVar6,uVar5,&r,&g,&b);
      *puVar4 = g << 8 | r | b << 0x10 | 0xff000000;
      local_60 = (uint *)((long)puVar4 + local_50);
      pp = pp + 6;
    }
    pp = pp + local_48;
    local_60 = local_60 + local_40;
    local_6c = local_6c - 1;
    uVar6 = local_54;
  } while (local_6c != 0);
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr41tile)
{
    (void)y;
    fromskew = (fromskew / 4) * (4 * 1 + 2);
    do
    {
        x = w >> 2;
        while (x > 0)
        {
            int32_t Cb = pp[4];
            int32_t Cr = pp[5];

            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            YCbCrtoRGB(cp[2], pp[2]);
            YCbCrtoRGB(cp[3], pp[3]);

            cp += 4;
            pp += 6;
            x--;
        }

        if ((w & 3) != 0)
        {
            int32_t Cb = pp[4];
            int32_t Cr = pp[5];

            switch ((w & 3))
            {
                case 3:
                    YCbCrtoRGB(cp[2], pp[2]); /*-fallthrough*/
                case 2:
                    YCbCrtoRGB(cp[1], pp[1]); /*-fallthrough*/
                case 1:
                    YCbCrtoRGB(cp[0], pp[0]); /*-fallthrough*/
                case 0:
                    break;
            }

            cp += (w & 3);
            pp += 6;
        }

        cp += toskew;
        pp += fromskew;
    } while (--h);
}